

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall
CVmObjStringBuffer::splice_text
          (CVmObjStringBuffer *this,vm_obj_id_t self,int32_t idx,int32_t del_chars,wchar_t *src,
          int32_t ins_chars,int undo)

{
  vm_strbuf_ext *pvVar1;
  int32_t in_ECX;
  int32_t in_EDX;
  int32_t in_ESI;
  CVmObjStringBuffer *in_RDI;
  int32_t *in_R8;
  int in_R9D;
  CVmObjStringBuffer *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  CVmObjStringBuffer *pCVar2;
  
  pCVar2 = in_RDI;
  adjust_args((CVmObjStringBuffer *)CONCAT44(in_ESI,in_EDX),
              (int32_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),in_R8,
              (int32_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8));
  if (in_stack_00000008 != 0) {
    add_undo_rec(unaff_retaddr,(vm_obj_id_t)((ulong)pCVar2 >> 0x20),(strbuf_undo_action)pCVar2,
                 in_ESI,in_EDX,in_ECX);
  }
  splice_move(unaff_retaddr,(int32_t)((ulong)pCVar2 >> 0x20),(int32_t)pCVar2,in_ESI);
  pvVar1 = get_ext(in_RDI);
  memcpy(pvVar1->buf + in_EDX,in_R8,(long)in_R9D << 2);
  return;
}

Assistant:

void CVmObjStringBuffer::splice_text(VMG_ vm_obj_id_t self,
                                     int32_t idx, int32_t del_chars,
                                     const wchar_t *src, int32_t ins_chars,
                                     int undo)
{
    /* check arguments */
    adjust_args(&idx, &del_chars, &ins_chars);

    /* if desired, save undo */
    if (undo)
        add_undo_rec(vmg_ self, STRBUF_UNDO_REPL, idx, del_chars, ins_chars);

    /* delete the old characters and open a gap for the new characters */
    splice_move(vmg_ idx, del_chars, ins_chars);

    /* copy in the characters */
    memcpy(get_ext()->buf + idx, src, ins_chars * sizeof(get_ext()->buf[0]));
}